

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void llvm::APInt::tcShiftLeft(WordType *Dst,uint Words,uint Count)

{
  int iVar1;
  sbyte sVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (Count == 0) {
    return;
  }
  uVar3 = (ulong)Words;
  uVar6 = (ulong)(Count >> 6);
  if (Words <= Count >> 6) {
    uVar6 = (ulong)Words;
  }
  uVar5 = (uint)uVar6;
  if ((Count & 0x3f) == 0) {
    memmove(Dst + uVar6,Dst,(ulong)((Words - uVar5) * 8));
  }
  else {
    sVar2 = (sbyte)(Count & 0x3f);
    while (uVar6 < uVar3) {
      iVar1 = (int)uVar3;
      uVar4 = Dst[-uVar5 + -1 + iVar1] << sVar2;
      uVar3 = uVar3 - 1;
      Dst[uVar3 & 0xffffffff] = uVar4;
      if (uVar5 < (uint)uVar3) {
        Dst[uVar3 & 0xffffffff] = Dst[iVar1 + -uVar5 + -2] >> (0x40U - sVar2 & 0x3f) | uVar4;
      }
    }
  }
  memset(Dst,0,(ulong)(uVar5 << 3));
  return;
}

Assistant:

void APInt::tcShiftLeft(WordType *Dst, unsigned Words, unsigned Count) {
  // Don't bother performing a no-op shift.
  if (!Count)
    return;

  // WordShift is the inter-part shift; BitShift is the intra-part shift.
  unsigned WordShift = std::min(Count / APINT_BITS_PER_WORD, Words);
  unsigned BitShift = Count % APINT_BITS_PER_WORD;

  // Fastpath for moving by whole words.
  if (BitShift == 0) {
    std::memmove(Dst + WordShift, Dst, (Words - WordShift) * APINT_WORD_SIZE);
  } else {
    while (Words-- > WordShift) {
      Dst[Words] = Dst[Words - WordShift] << BitShift;
      if (Words > WordShift)
        Dst[Words] |=
          Dst[Words - WordShift - 1] >> (APINT_BITS_PER_WORD - BitShift);
    }
  }

  // Fill in the remainder with 0s.
  std::memset(Dst, 0, WordShift * APINT_WORD_SIZE);
}